

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

bool bssl::anon_unknown_0::CipherListsEqual
               (SSL_CTX *ctx,
               vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
               *expected)

{
  uint uVar1;
  pointer pEVar2;
  pointer pEVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  OPENSSL_STACK *sk;
  size_t sVar7;
  SSL_CIPHER *c;
  ulong uVar8;
  long lVar9;
  
  sk = (OPENSSL_STACK *)SSL_CTX_get_ciphers(ctx);
  sVar7 = OPENSSL_sk_num(sk);
  pEVar2 = (expected->
           super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (expected->
           super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (sVar7 == (long)pEVar3 - (long)pEVar2 >> 4) {
    bVar5 = true;
    if (pEVar3 != pEVar2) {
      lVar9 = 0;
      sVar7 = 0;
      do {
        c = (SSL_CIPHER *)OPENSSL_sk_value(sk,sVar7);
        uVar4 = *(ulong *)((long)&((expected->
                                   super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->id + lVar9);
        uVar8 = SSL_CIPHER_get_id(c);
        if (uVar4 != (uVar8 & 0xffffffff)) goto LAB_0015dc3d;
        uVar1 = *(uint *)((long)&((expected->
                                  super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->in_group_flag + lVar9
                         );
        iVar6 = SSL_CTX_cipher_in_group(ctx,sVar7);
        if (uVar1 != (iVar6 != 0)) goto LAB_0015dc3d;
        sVar7 = sVar7 + 1;
        lVar9 = lVar9 + 0x10;
      } while (sVar7 < (ulong)((long)(expected->
                                     super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(expected->
                                     super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 4));
      bVar5 = true;
    }
  }
  else {
LAB_0015dc3d:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool CipherListsEqual(SSL_CTX *ctx,
                             const std::vector<ExpectedCipher> &expected) {
  const STACK_OF(SSL_CIPHER) *ciphers = SSL_CTX_get_ciphers(ctx);
  if (sk_SSL_CIPHER_num(ciphers) != expected.size()) {
    return false;
  }

  for (size_t i = 0; i < expected.size(); i++) {
    const SSL_CIPHER *cipher = sk_SSL_CIPHER_value(ciphers, i);
    if (expected[i].id != SSL_CIPHER_get_id(cipher) ||
        expected[i].in_group_flag != !!SSL_CTX_cipher_in_group(ctx, i)) {
      return false;
    }
  }

  return true;
}